

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerlinNoise.cpp
# Opt level: O2

double __thiscall PerlinNoise::noise(PerlinNoise *this,double x,double y,double z)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  PerlinNoise *this_00;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double y_00;
  double y_01;
  double x_00;
  double z_00;
  double dVar13;
  double dVar14;
  
  this_00 = this;
  dVar8 = floor(x);
  dVar9 = floor(y);
  dVar10 = floor(z);
  uVar6 = (ulong)((int)dVar10 & 0xff);
  x_00 = x - dVar8;
  y_00 = y - dVar9;
  dVar10 = z - dVar10;
  dVar13 = ((x_00 * 6.0 + -15.0) * x_00 + 10.0) * x_00 * x_00 * x_00;
  dVar14 = ((y_00 * 6.0 + -15.0) * y_00 + 10.0) * y_00 * y_00 * y_00;
  piVar5 = (this->p).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar7 = (long)piVar5[(int)dVar8 & 0xff] + (ulong)((int)dVar9 & 0xff);
  iVar1 = piVar5[lVar7];
  iVar2 = piVar5[lVar7 + 1];
  lVar7 = (long)piVar5[(ulong)((int)dVar8 & 0xff) + 1] + (ulong)((int)dVar9 & 0xff);
  iVar3 = piVar5[lVar7];
  iVar4 = piVar5[lVar7 + 1];
  dVar11 = grad(this_00,piVar5[(long)iVar1 + uVar6],x_00,y_00,dVar10);
  dVar8 = x_00 + -1.0;
  dVar9 = grad(this_00,piVar5[(long)iVar3 + uVar6],dVar8,y_00,dVar10);
  dVar11 = (dVar9 - dVar11) * dVar13 + dVar11;
  y_01 = y_00 + -1.0;
  dVar9 = grad(this_00,piVar5[(long)iVar2 + uVar6],x_00,y_01,dVar10);
  dVar12 = grad(this_00,piVar5[(long)iVar4 + uVar6],dVar8,y_01,dVar10);
  dVar11 = (((dVar12 - dVar9) * dVar13 + dVar9) - dVar11) * dVar14 + dVar11;
  z_00 = dVar10 + -1.0;
  dVar12 = grad(this_00,piVar5[(long)iVar1 + uVar6 + 1],x_00,y_00,z_00);
  dVar9 = grad(this_00,piVar5[(long)iVar3 + uVar6 + 1],dVar8,y_00,z_00);
  dVar12 = (dVar9 - dVar12) * dVar13 + dVar12;
  dVar9 = grad(this_00,piVar5[(long)iVar2 + uVar6 + 1],x_00,y_01,z_00);
  dVar8 = grad(this_00,piVar5[(long)iVar4 + uVar6 + 1],dVar8,y_01,z_00);
  return ((((((dVar8 - dVar9) * dVar13 + dVar9) - dVar12) * dVar14 + dVar12) - dVar11) *
          ((dVar10 * 6.0 + -15.0) * dVar10 + 10.0) * dVar10 * dVar10 * dVar10 + dVar11 + 1.0) * 0.5;
}

Assistant:

double PerlinNoise::noise(double x, double y, double z) {
    // Find the unit cube that contains the point
    int X = (int) floor(x) & 255;
    int Y = (int) floor(y) & 255;
    int Z = (int) floor(z) & 255;

    // Find relative x, y,z of point in cube
    x -= floor(x);
    y -= floor(y);
    z -= floor(z);

    // Compute fade curves for each of x, y, z
    double u = fade(x);
    double v = fade(y);
    double w = fade(z);

    // Hash coordinates of the 8 cube corners
    int A = p[X] + Y;
    int AA = p[A] + Z;
    int AB = p[A + 1] + Z;
    int B = p[X + 1] + Y;
    int BA = p[B] + Z;
    int BB = p[B + 1] + Z;

    // Add blended results from 8 corners of cube
    double res = 
        lerp(w,
            lerp(v,
                lerp(u,
                    grad(p[AA], x, y, z),
                    grad(p[BA], x-1, y, z)),
                lerp(u,
                    grad(p[AB], x, y-1, z),
                    grad(p[BB], x-1, y-1, z))),
            lerp(v,
                lerp(u,
                    grad(p[AA+1],x, y, z-1),
                    grad(p[BA+1], x-1, y, z-1)),
                lerp(u, grad(p[AB+1], x, y-1, z-1),
                    grad(p[BB+1], x-1, y-1, z-1))));

    return (res + 1.0) / 2.0;
}